

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O3

int luaK_numberK(FuncState *fs,lua_Number r)

{
  int iVar1;
  Value *key;
  lua_Integer ik;
  TValue o;
  TValue kv;
  long local_30;
  Value local_28;
  undefined1 local_20;
  Value local_18;
  undefined1 local_10;
  
  local_20 = 0x13;
  local_28.n = r;
  iVar1 = luaV_flttointeger(r,&local_30,F2Ieq);
  if (iVar1 == 0) {
    key = &local_28;
  }
  else {
    local_18.n = ldexp(1.0,-0x34);
    if (local_30 != 0) {
      local_18.n = local_18.n * r + r;
    }
    key = &local_18;
    local_10 = 0x13;
  }
  iVar1 = addk(fs,(TValue *)key,(TValue *)&local_28);
  return iVar1;
}

Assistant:

static int luaK_numberK (FuncState *fs, lua_Number r) {
  TValue o;
  lua_Integer ik;
  setfltvalue(&o, r);
  if (!luaV_flttointeger(r, &ik, F2Ieq))  /* not an integral value? */
    return addk(fs, &o, &o);  /* use number itself as key */
  else {  /* must build an alternative key */
    const int nbm = l_floatatt(MANT_DIG);
    const lua_Number q = l_mathop(ldexp)(l_mathop(1.0), -nbm + 1);
    const lua_Number k = (ik == 0) ? q : r + r*q;  /* new key */
    TValue kv;
    setfltvalue(&kv, k);
    /* result is not an integral value, unless value is too large */
    lua_assert(!luaV_flttointeger(k, &ik, F2Ieq) ||
                l_mathop(fabs)(r) >= l_mathop(1e6));
    return addk(fs, &kv, &o);
  }
}